

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Const * kratos::Const::constant(string *value,uint32_t width)

{
  shared_ptr<kratos::StringConst> sVar1;
  undefined1 local_28 [8];
  shared_ptr<kratos::StringConst> p;
  uint32_t width_local;
  
  p.super___shared_ptr<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       width;
  sVar1 = std::make_shared<kratos::StringConst,std::__cxx11::string,unsigned_int&>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
                     (uint *)value);
  std::
  _Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::StringConst>&>
            ((_Hashtable<std::shared_ptr<kratos::Const>,std::shared_ptr<kratos::Const>,std::allocator<std::shared_ptr<kratos::Const>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Const>>,std::hash<std::shared_ptr<kratos::Const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&consts_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28,
             sVar1.super___shared_ptr<kratos::StringConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  return (Const *)local_28;
}

Assistant:

Const &Const::constant(std::string value, uint32_t width) {
    auto p = std::make_shared<StringConst>(std::move(value), width);
    consts_.emplace(p);
    return *p;
}